

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::Descriptor::ExtensionRange::GetLocationPath
          (ExtensionRange *this,vector<int,_std::allocator<int>_> *output)

{
  int local_18 [2];
  
  Descriptor::GetLocationPath(this->containing_type_,output);
  local_18[1] = 5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,local_18 + 1);
  local_18[0] = (int)(((long)this - (long)this->containing_type_->extension_ranges_) / 0x28);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,local_18);
  return;
}

Assistant:

void Descriptor::ExtensionRange::GetLocationPath(
    std::vector<int>* output) const {
  containing_type()->GetLocationPath(output);
  output->push_back(DescriptorProto::kExtensionRangeFieldNumber);
  output->push_back(index());
}